

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::LogToAllLogfiles
               (LogSeverity severity,time_point *timestamp,char *message,size_t len)

{
  int i;
  
  if (fLB::FLAGS_logtostdout == '\x01') {
    ColoredWriteToStdout(severity,message,len);
    return;
  }
  if (fLB::FLAGS_logtostderr == '\0') {
    for (; -1 < (int)severity; severity = severity - GLOG_WARNING) {
      MaybeLogToLogfile(severity,timestamp,message,len);
    }
    return;
  }
  ColoredWriteToStderr(severity,message,len);
  return;
}

Assistant:

inline void LogDestination::LogToAllLogfiles(
    LogSeverity severity,
    const std::chrono::system_clock::time_point& timestamp, const char* message,
    size_t len) {
  if (FLAGS_logtostdout) {  // global flag: never log to file
    ColoredWriteToStdout(severity, message, len);
  } else if (FLAGS_logtostderr) {  // global flag: never log to file
    ColoredWriteToStderr(severity, message, len);
  } else {
    for (int i = severity; i >= 0; --i) {
      LogDestination::MaybeLogToLogfile(static_cast<LogSeverity>(i), timestamp,
                                        message, len);
    }
  }
}